

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  ulong uVar582;
  secp256k1_fe *r;
  byte bVar583;
  long lVar584;
  uint uVar585;
  uchar *a;
  ulong uVar586;
  uint uVar587;
  ulong uVar588;
  uint64_t *puVar589;
  secp256k1_fe *psVar590;
  ulong uVar591;
  ulong uVar592;
  ulong uVar593;
  ulong uVar594;
  ulong uVar595;
  ulong uVar596;
  int iVar597;
  ulong uVar598;
  int iVar599;
  ulong uVar600;
  ulong uVar601;
  long lVar602;
  ulong uVar603;
  ulong uVar604;
  bool bVar605;
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined4 uVar618;
  undefined4 uVar619;
  uint negative;
  int overflow;
  secp256k1_fe xd;
  secp256k1_scalar s;
  secp256k1_fe global_z;
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_scalar s_1;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xn;
  uchar sx [32];
  secp256k1_fe px;
  uint local_dcc;
  undefined1 local_dc8 [16];
  undefined1 local_db8 [16];
  ulong local_da8;
  undefined1 auStack_da0 [16];
  undefined1 local_d90 [16];
  ulong local_d80;
  int iStack_d78;
  ulong local_d70;
  undefined8 local_d68;
  ulong local_d60;
  ulong local_d58;
  ulong local_d50;
  ulong local_d48;
  ulong local_d40;
  ulong local_d38;
  ulong local_d30;
  uchar *local_d28;
  uchar *local_d20;
  uchar *local_d18;
  secp256k1_fe local_d10;
  secp256k1_scalar local_ce8;
  secp256k1_fe local_cc0;
  undefined1 local_c98 [96];
  ulong uStack_c38;
  undefined1 local_c30 [16];
  int local_c20;
  secp256k1_scalar local_c10;
  secp256k1_scalar local_bf0;
  secp256k1_scalar local_bd0;
  secp256k1_fe local_bb0;
  secp256k1_fe local_b88;
  secp256k1_fe local_b60;
  undefined1 local_b38 [24];
  ulong uStack_b20;
  ulong local_b18;
  uint64_t local_b10;
  uint64_t uStack_b08;
  uint64_t local_b00;
  uint64_t uStack_af8;
  ulong local_af0;
  undefined1 auStack_ae0 [16];
  undefined1 auStack_ad0 [16];
  ulong uStack_ac0;
  undefined1 auStack_ab8 [16];
  undefined1 auStack_aa8 [16];
  ulong auStack_a98 [156];
  undefined1 local_5b8 [24];
  ulong uStack_5a0;
  ulong local_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  ulong local_570;
  undefined1 auStack_560 [16];
  undefined1 auStack_550 [16];
  ulong uStack_540;
  undefined1 auStack_538 [16];
  undefined1 auStack_528 [16];
  ulong auStack_518 [157];
  
  bVar583 = 0;
  if (output == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_5();
  }
  else if (ell_a64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_4();
  }
  else if (ell_b64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_3();
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_2();
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_d28 = output;
      local_d20 = ell_a64;
      local_d18 = ell_b64;
      secp256k1_fe_impl_set_b32_mod(&local_b88,a);
      secp256k1_fe_impl_set_b32_mod(&local_bb0,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&local_b60,&local_d10,&local_b88,&local_bb0);
      secp256k1_scalar_set_b32(&local_ce8,seckey32,(int *)&local_dcc);
      local_dcc = CONCAT31(0,((local_ce8.d[1] == 0 && local_ce8.d[0] == 0) && local_ce8.d[2] == 0)
                             && local_ce8.d[3] == 0);
      local_b38._0_4_ = local_dcc;
      local_d30 = (long)(int)local_dcc - 1;
      local_d48 = (ulong)local_dcc | local_ce8.d[0] & local_d30;
      local_d40 = local_ce8.d[1] & local_d30;
      local_d38 = local_ce8.d[2] & local_d30;
      local_d30 = local_d30 & local_ce8.d[3];
      uVar582 = local_b60.n[0] * 2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_b60.n[3];
      auVar302._8_8_ = 0;
      auVar302._0_8_ = uVar582;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_b60.n[2];
      auVar303._8_8_ = 0;
      auVar303._0_8_ = local_b60.n[1] * 2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_b60.n[4];
      auVar304._8_8_ = 0;
      auVar304._0_8_ = local_b60.n[4];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = SUB168(auVar3 * auVar304,0);
      auVar1 = auVar4 * ZEXT816(0x1000003d10) + auVar2 * auVar303 + auVar1 * auVar302;
      uVar586 = local_b60.n[4] * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar586;
      auVar305._8_8_ = 0;
      auVar305._0_8_ = local_b60.n[0];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_b60.n[3];
      auVar306._8_8_ = 0;
      auVar306._0_8_ = local_b60.n[1] * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_b60.n[2];
      auVar307._8_8_ = 0;
      auVar307._0_8_ = local_b60.n[2];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar3 * auVar304,8);
      auVar4 = auVar8 * ZEXT816(0x1000003d10000) +
               auVar5 * auVar305 + auVar7 * auVar307 + auVar6 * auVar306 + (auVar1 >> 0x34);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_b60.n[0];
      auVar308._8_8_ = 0;
      auVar308._0_8_ = local_b60.n[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar586;
      auVar309._8_8_ = 0;
      auVar309._0_8_ = local_b60.n[1];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_b60.n[3];
      auVar310._8_8_ = 0;
      auVar310._0_8_ = local_b60.n[2] * 2;
      auVar2 = auVar11 * auVar310 + auVar10 * auVar309 + (auVar4 >> 0x34);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
      auVar3 = auVar12 * ZEXT816(0x1000003d1) + auVar9 * auVar308;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_b60.n[1];
      auVar311._8_8_ = 0;
      auVar311._0_8_ = uVar582;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar586;
      auVar312._8_8_ = 0;
      auVar312._0_8_ = local_b60.n[2];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b60.n[3];
      auVar313._8_8_ = 0;
      auVar313._0_8_ = local_b60.n[3];
      auVar2 = auVar15 * auVar313 + auVar14 * auVar312 + (auVar2 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar5 = auVar16 * ZEXT816(0x1000003d10) + auVar13 * auVar311 + (auVar3 >> 0x34);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_b60.n[2];
      auVar314._8_8_ = 0;
      auVar314._0_8_ = uVar582;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_b60.n[1];
      auVar315._8_8_ = 0;
      auVar315._0_8_ = local_b60.n[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar586;
      auVar316._8_8_ = 0;
      auVar316._0_8_ = local_b60.n[3];
      auVar2 = auVar19 * auVar316 + (auVar2 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar2._0_8_;
      auVar6 = auVar20 * ZEXT816(0x1000003d10) + auVar18 * auVar315 + auVar17 * auVar314 +
               (auVar5 >> 0x34);
      auVar7 = auVar6 >> 0x34;
      auVar555._8_8_ = 0;
      auVar555._0_8_ = auVar7._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar2._8_8_;
      auVar554._8_8_ = auVar7._8_8_;
      auVar554._0_8_ = auVar1._0_8_ & 0xffffffffffffe;
      auVar555 = auVar21 * ZEXT816(0x1000003d10000) + auVar554 + auVar555;
      uVar586 = auVar555._0_8_;
      uVar582 = auVar3._0_8_ & 0xfffffffffffff;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar582;
      auVar317._8_8_ = 0;
      auVar317._0_8_ = local_b60.n[3];
      uVar593 = (auVar555._8_8_ << 0xc | uVar586 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
      uVar588 = auVar5._0_8_ & 0xfffffffffffff;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar588;
      auVar318._8_8_ = 0;
      auVar318._0_8_ = local_b60.n[2];
      uVar603 = auVar6._0_8_ & 0xfffffffffffff;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar603;
      auVar319._8_8_ = 0;
      auVar319._0_8_ = local_b60.n[1];
      uVar586 = uVar586 & 0xfffffffffffff;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar586;
      auVar320._8_8_ = 0;
      auVar320._0_8_ = local_b60.n[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar593;
      auVar321._8_8_ = 0;
      auVar321._0_8_ = local_b60.n[4];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = SUB168(auVar26 * auVar321,0);
      auVar4 = auVar23 * auVar318 + auVar22 * auVar317 + auVar24 * auVar319 + auVar25 * auVar320 +
               auVar27 * ZEXT816(0x1000003d10);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar582;
      auVar322._8_8_ = 0;
      auVar322._0_8_ = local_b60.n[4];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar588;
      auVar323._8_8_ = 0;
      auVar323._0_8_ = local_b60.n[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar603;
      auVar324._8_8_ = 0;
      auVar324._0_8_ = local_b60.n[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar586;
      auVar325._8_8_ = 0;
      auVar325._0_8_ = local_b60.n[1];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar593;
      auVar326._8_8_ = 0;
      auVar326._0_8_ = local_b60.n[0];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = SUB168(auVar26 * auVar321,8);
      auVar1 = auVar33 * ZEXT816(0x1000003d10000) +
               auVar32 * auVar326 +
               auVar31 * auVar325 + auVar30 * auVar324 + auVar28 * auVar322 + auVar29 * auVar323 +
               (auVar4 >> 0x34);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar582;
      auVar327._8_8_ = 0;
      auVar327._0_8_ = local_b60.n[0];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar588;
      auVar328._8_8_ = 0;
      auVar328._0_8_ = local_b60.n[4];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar603;
      auVar329._8_8_ = 0;
      auVar329._0_8_ = local_b60.n[3];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar586;
      auVar330._8_8_ = 0;
      auVar330._0_8_ = local_b60.n[2];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar593;
      auVar331._8_8_ = 0;
      auVar331._0_8_ = local_b60.n[1];
      auVar2 = auVar38 * auVar331 + auVar37 * auVar330 + auVar36 * auVar329 + auVar35 * auVar328 +
               (auVar1 >> 0x34);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar3 = auVar34 * auVar327 + auVar39 * ZEXT816(0x1000003d1);
      local_d50 = auVar3._0_8_;
      uVar591 = auVar3._8_8_;
      auVar545._8_8_ = uVar591 >> 0x34;
      auVar545._0_8_ = uVar591 * 0x1000 | local_d50 >> 0x34;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar582;
      auVar332._8_8_ = 0;
      auVar332._0_8_ = local_b60.n[1];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar588;
      auVar333._8_8_ = 0;
      auVar333._0_8_ = local_b60.n[0];
      local_d50 = local_d50 & 0xfffffffffffff;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar603;
      auVar334._8_8_ = 0;
      auVar334._0_8_ = local_b60.n[4];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar586;
      auVar335._8_8_ = 0;
      auVar335._0_8_ = local_b60.n[3];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar593;
      auVar336._8_8_ = 0;
      auVar336._0_8_ = local_b60.n[2];
      auVar2 = auVar44 * auVar336 + auVar43 * auVar335 + auVar42 * auVar334 + (auVar2 >> 0x34);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar545 = auVar45 * ZEXT816(0x1000003d10) + auVar40 * auVar332 + auVar41 * auVar333 +
                 auVar545;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar582;
      auVar337._8_8_ = 0;
      auVar337._0_8_ = local_b60.n[2];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar588;
      auVar338._8_8_ = 0;
      auVar338._0_8_ = local_b60.n[1];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar603;
      auVar339._8_8_ = 0;
      auVar339._0_8_ = local_b60.n[0];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar586;
      auVar340._8_8_ = 0;
      auVar340._0_8_ = local_b60.n[4];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar593;
      auVar341._8_8_ = 0;
      auVar341._0_8_ = local_b60.n[3];
      auVar2 = auVar50 * auVar341 + auVar49 * auVar340 + (auVar2 >> 0x34);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar2._0_8_;
      auVar3 = auVar51 * ZEXT816(0x1000003d10) +
               auVar48 * auVar339 + auVar47 * auVar338 + auVar46 * auVar337 + (auVar545 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar557._8_8_ = 0;
      auVar557._0_8_ = auVar5._0_8_;
      local_d58 = auVar3._0_8_ & 0xfffffffffffff;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = auVar2._8_8_;
      auVar556._8_8_ = auVar5._8_8_;
      auVar556._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar557 = auVar52 * ZEXT816(0x1000003d10000) + auVar556 + auVar557;
      uVar603 = auVar557._0_8_;
      local_d60 = auVar557._8_8_ << 0xc | uVar603 >> 0x34;
      uVar582 = local_d10.n[0] * 2;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_d10.n[3];
      auVar342._8_8_ = 0;
      auVar342._0_8_ = uVar582;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_d10.n[2];
      auVar343._8_8_ = 0;
      auVar343._0_8_ = local_d10.n[1] * 2;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_d10.n[4];
      auVar344._8_8_ = 0;
      auVar344._0_8_ = local_d10.n[4];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = SUB168(auVar55 * auVar344,0);
      auVar4 = auVar54 * auVar343 + auVar53 * auVar342 + auVar56 * ZEXT816(0x1000003d10);
      uVar586 = local_d10.n[4] * 2;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar586;
      auVar345._8_8_ = 0;
      auVar345._0_8_ = local_d10.n[0];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_d10.n[3];
      auVar346._8_8_ = 0;
      auVar346._0_8_ = local_d10.n[1] * 2;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_d10.n[2];
      auVar347._8_8_ = 0;
      auVar347._0_8_ = local_d10.n[2];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = SUB168(auVar55 * auVar344,8);
      auVar2 = auVar60 * ZEXT816(0x1000003d10000) +
               auVar57 * auVar345 + auVar59 * auVar347 + auVar58 * auVar346 + (auVar4 >> 0x34);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_d10.n[0];
      auVar348._8_8_ = 0;
      auVar348._0_8_ = local_d10.n[0];
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar586;
      auVar349._8_8_ = 0;
      auVar349._0_8_ = local_d10.n[1];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_d10.n[3];
      auVar350._8_8_ = 0;
      auVar350._0_8_ = local_d10.n[2] * 2;
      auVar3 = auVar63 * auVar350 + auVar62 * auVar349 + (auVar2 >> 0x34);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar5 = auVar64 * ZEXT816(0x1000003d1) + auVar61 * auVar348;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_d10.n[1];
      auVar351._8_8_ = 0;
      auVar351._0_8_ = uVar582;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar586;
      auVar352._8_8_ = 0;
      auVar352._0_8_ = local_d10.n[2];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_d10.n[3];
      auVar353._8_8_ = 0;
      auVar353._0_8_ = local_d10.n[3];
      auVar3 = auVar67 * auVar353 + auVar66 * auVar352 + (auVar3 >> 0x34);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar6 = (auVar5 >> 0x34) + auVar65 * auVar351 + auVar68 * ZEXT816(0x1000003d10);
      uVar588 = auVar6._0_8_;
      uVar591 = auVar6._8_8_;
      auVar546._8_8_ = uVar591 >> 0x34;
      auVar546._0_8_ = uVar591 * 0x1000 | uVar588 >> 0x34;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_d10.n[2];
      auVar354._8_8_ = 0;
      auVar354._0_8_ = uVar582;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_d10.n[1];
      auVar355._8_8_ = 0;
      auVar355._0_8_ = local_d10.n[1];
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar586;
      auVar356._8_8_ = 0;
      auVar356._0_8_ = local_d10.n[3];
      auVar3 = auVar71 * auVar356 + (auVar3 >> 0x34);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auVar3._0_8_;
      auVar546 = auVar72 * ZEXT816(0x1000003d10) + auVar70 * auVar355 + auVar69 * auVar354 +
                 auVar546;
      auVar6 = auVar546 >> 0x34;
      auVar559._8_8_ = 0;
      auVar559._0_8_ = auVar6._0_8_;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = auVar3._8_8_;
      auVar558._8_8_ = auVar6._8_8_;
      auVar558._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
      auVar559 = auVar73 * ZEXT816(0x1000003d10000) + auVar558 + auVar559;
      uVar591 = auVar559._0_8_;
      uVar582 = (auVar5._0_8_ & 0xfffffffffffff) * 7;
      uVar586 = (uVar588 & 0xfffffffffffff) * 7;
      local_d70 = (auVar546._0_8_ & 0xfffffffffffff) * 7;
      uVar588 = (uVar591 & 0xfffffffffffff) * 7;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar582;
      auVar357._8_8_ = 0;
      auVar357._0_8_ = local_d10.n[3];
      uVar591 = ((auVar559._8_8_ << 0xc | uVar591 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff)) * 7;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar586;
      auVar358._8_8_ = 0;
      auVar358._0_8_ = local_d10.n[2];
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_d70;
      auVar359._8_8_ = 0;
      auVar359._0_8_ = local_d10.n[1];
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar588;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = local_d10.n[0];
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar591;
      auVar361._8_8_ = 0;
      auVar361._0_8_ = local_d10.n[4];
      auVar79._8_8_ = 0;
      auVar79._0_8_ = SUB168(auVar78 * auVar361,0);
      auVar5 = auVar75 * auVar358 + auVar74 * auVar357 + auVar76 * auVar359 + auVar77 * auVar360 +
               auVar79 * ZEXT816(0x1000003d10);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar582;
      auVar362._8_8_ = 0;
      auVar362._0_8_ = local_d10.n[4];
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar586;
      auVar363._8_8_ = 0;
      auVar363._0_8_ = local_d10.n[3];
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_d70;
      auVar364._8_8_ = 0;
      auVar364._0_8_ = local_d10.n[2];
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar588;
      auVar365._8_8_ = 0;
      auVar365._0_8_ = local_d10.n[1];
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar591;
      auVar366._8_8_ = 0;
      auVar366._0_8_ = local_d10.n[0];
      auVar85._8_8_ = 0;
      auVar85._0_8_ = SUB168(auVar78 * auVar361,8);
      auVar2 = auVar85 * ZEXT816(0x1000003d10000) +
               auVar84 * auVar366 +
               auVar83 * auVar365 + auVar82 * auVar364 + auVar81 * auVar363 + auVar80 * auVar362 +
               (auVar5 >> 0x34);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar582;
      auVar367._8_8_ = 0;
      auVar367._0_8_ = local_d10.n[0];
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar586;
      auVar368._8_8_ = 0;
      auVar368._0_8_ = local_d10.n[4];
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_d70;
      auVar369._8_8_ = 0;
      auVar369._0_8_ = local_d10.n[3];
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar588;
      auVar370._8_8_ = 0;
      auVar370._0_8_ = local_d10.n[2];
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar591;
      auVar371._8_8_ = 0;
      auVar371._0_8_ = local_d10.n[1];
      auVar3 = auVar90 * auVar371 + auVar89 * auVar370 + auVar88 * auVar369 + auVar87 * auVar368 +
               (auVar2 >> 0x34);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar86 * auVar367 + auVar91 * ZEXT816(0x1000003d1);
      uVar593 = auVar4._0_8_;
      uVar592 = auVar4._8_8_;
      auVar547._8_8_ = uVar592 >> 0x34;
      auVar547._0_8_ = uVar592 * 0x1000 | uVar593 >> 0x34;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar582;
      auVar372._8_8_ = 0;
      auVar372._0_8_ = local_d10.n[1];
      local_d68 = SUB168(auVar92 * auVar372,0);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar586;
      auVar373._8_8_ = 0;
      auVar373._0_8_ = local_d10.n[0];
      auVar94._8_8_ = 0;
      auVar94._0_8_ = local_d70;
      auVar374._8_8_ = 0;
      auVar374._0_8_ = local_d10.n[4];
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar588;
      auVar375._8_8_ = 0;
      auVar375._0_8_ = local_d10.n[3];
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar591;
      auVar376._8_8_ = 0;
      auVar376._0_8_ = local_d10.n[2];
      auVar3 = auVar96 * auVar376 + auVar95 * auVar375 + auVar94 * auVar374 + (auVar3 >> 0x34);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar547 = auVar97 * ZEXT816(0x1000003d10) + auVar92 * auVar372 + auVar93 * auVar373 +
                 auVar547;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar582;
      auVar377._8_8_ = 0;
      auVar377._0_8_ = local_d10.n[2];
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar586;
      auVar378._8_8_ = 0;
      auVar378._0_8_ = local_d10.n[1];
      auVar100._8_8_ = 0;
      auVar100._0_8_ = local_d70;
      auVar379._8_8_ = 0;
      auVar379._0_8_ = local_d10.n[0];
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar588;
      auVar380._8_8_ = 0;
      auVar380._0_8_ = local_d10.n[4];
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar591;
      auVar381._8_8_ = 0;
      auVar381._0_8_ = local_d10.n[3];
      auVar3 = auVar102 * auVar381 + auVar101 * auVar380 + (auVar3 >> 0x34);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = auVar3._0_8_;
      auVar4 = auVar103 * ZEXT816(0x1000003d10) +
               auVar100 * auVar379 + auVar99 * auVar378 + auVar98 * auVar377 + (auVar547 >> 0x34);
      auVar6 = auVar4 >> 0x34;
      auVar561._8_8_ = 0;
      auVar561._0_8_ = auVar6._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = auVar3._8_8_;
      auVar560._8_8_ = auVar6._8_8_;
      auVar560._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
      auVar561 = auVar104 * ZEXT816(0x1000003d10000) + auVar560 + auVar561;
      uVar582 = auVar561._0_8_;
      uVar598 = (uVar582 & 0xfffffffffffff) + (uVar603 & 0xfffffffffffff);
      uVar588 = (uVar593 & 0xfffffffffffff) + local_d50;
      uVar600 = (auVar547._0_8_ & 0xfffffffffffff) + (auVar545._0_8_ & 0xfffffffffffff);
      uVar594 = (auVar4._0_8_ & 0xfffffffffffff) + local_d58;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar588;
      auVar382._8_8_ = 0;
      auVar382._0_8_ = local_b60.n[3];
      uVar595 = (auVar2._0_8_ & 0xffffffffffff) + (auVar1._0_8_ & 0xffffffffffff) + local_d60 +
                (auVar561._8_8_ << 0xc | uVar582 >> 0x34);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar600;
      auVar383._8_8_ = 0;
      auVar383._0_8_ = local_b60.n[2];
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar594;
      auVar384._8_8_ = 0;
      auVar384._0_8_ = local_b60.n[1];
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar598;
      auVar385._8_8_ = 0;
      auVar385._0_8_ = local_b60.n[0];
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar595;
      auVar386._8_8_ = 0;
      auVar386._0_8_ = local_b60.n[4];
      auVar110._8_8_ = 0;
      auVar110._0_8_ = SUB168(auVar109 * auVar386,0);
      auVar4 = auVar106 * auVar383 + auVar105 * auVar382 + auVar107 * auVar384 + auVar108 * auVar385
               + auVar110 * ZEXT816(0x1000003d10);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar588;
      auVar387._8_8_ = 0;
      auVar387._0_8_ = local_b60.n[4];
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar600;
      auVar388._8_8_ = 0;
      auVar388._0_8_ = local_b60.n[3];
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar594;
      auVar389._8_8_ = 0;
      auVar389._0_8_ = local_b60.n[2];
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar598;
      auVar390._8_8_ = 0;
      auVar390._0_8_ = local_b60.n[1];
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar595;
      auVar391._8_8_ = 0;
      auVar391._0_8_ = local_b60.n[0];
      auVar116._8_8_ = 0;
      auVar116._0_8_ = SUB168(auVar109 * auVar386,8);
      auVar1 = auVar116 * ZEXT816(0x1000003d10000) +
               auVar115 * auVar391 +
               auVar114 * auVar390 + auVar113 * auVar389 + auVar111 * auVar387 + auVar112 * auVar388
               + (auVar4 >> 0x34);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uVar588;
      auVar392._8_8_ = 0;
      auVar392._0_8_ = local_b60.n[0];
      auVar118._8_8_ = 0;
      auVar118._0_8_ = uVar600;
      auVar393._8_8_ = 0;
      auVar393._0_8_ = local_b60.n[4];
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uVar594;
      auVar394._8_8_ = 0;
      auVar394._0_8_ = local_b60.n[3];
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uVar598;
      auVar395._8_8_ = 0;
      auVar395._0_8_ = local_b60.n[2];
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uVar595;
      auVar396._8_8_ = 0;
      auVar396._0_8_ = local_b60.n[1];
      auVar2 = auVar121 * auVar396 + auVar120 * auVar395 + auVar119 * auVar394 + auVar118 * auVar393
               + (auVar1 >> 0x34);
      auVar122._8_8_ = 0;
      auVar122._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar3 = auVar117 * auVar392 + auVar122 * ZEXT816(0x1000003d1);
      uVar591 = auVar3._0_8_;
      uVar582 = auVar3._8_8_;
      auVar548._8_8_ = uVar582 >> 0x34;
      auVar548._0_8_ = uVar582 * 0x1000 | uVar591 >> 0x34;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar588;
      auVar397._8_8_ = 0;
      auVar397._0_8_ = local_b60.n[1];
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar600;
      auVar398._8_8_ = 0;
      auVar398._0_8_ = local_b60.n[0];
      auVar125._8_8_ = 0;
      auVar125._0_8_ = uVar594;
      auVar399._8_8_ = 0;
      auVar399._0_8_ = local_b60.n[4];
      auVar126._8_8_ = 0;
      auVar126._0_8_ = uVar598;
      auVar400._8_8_ = 0;
      auVar400._0_8_ = local_b60.n[3];
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar595;
      auVar401._8_8_ = 0;
      auVar401._0_8_ = local_b60.n[2];
      auVar2 = auVar127 * auVar401 + auVar126 * auVar400 + auVar125 * auVar399 + (auVar2 >> 0x34);
      auVar128._8_8_ = 0;
      auVar128._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar548 = auVar128 * ZEXT816(0x1000003d10) + auVar123 * auVar397 + auVar124 * auVar398 +
                 auVar548;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar588;
      auVar402._8_8_ = 0;
      auVar402._0_8_ = local_b60.n[2];
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar600;
      auVar403._8_8_ = 0;
      auVar403._0_8_ = local_b60.n[1];
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar594;
      auVar404._8_8_ = 0;
      auVar404._0_8_ = local_b60.n[0];
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar598;
      auVar405._8_8_ = 0;
      auVar405._0_8_ = local_b60.n[4];
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uVar595;
      auVar406._8_8_ = 0;
      auVar406._0_8_ = local_b60.n[3];
      auVar2 = auVar133 * auVar406 + auVar132 * auVar405 + (auVar2 >> 0x34);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = auVar2._0_8_;
      auVar3 = auVar134 * ZEXT816(0x1000003d10) +
               auVar131 * auVar404 + auVar130 * auVar403 + auVar129 * auVar402 + (auVar548 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar563._8_8_ = 0;
      auVar563._0_8_ = auVar5._0_8_;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = auVar2._8_8_;
      auVar562._8_8_ = auVar5._8_8_;
      auVar562._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar563 = auVar135 * ZEXT816(0x1000003d10000) + auVar562 + auVar563;
      uVar592 = auVar563._0_8_;
      uVar582 = uVar588 * 2;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar598;
      auVar407._8_8_ = 0;
      auVar407._0_8_ = uVar582;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar594;
      auVar408._8_8_ = 0;
      auVar408._0_8_ = uVar600 * 2;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar595;
      auVar409._8_8_ = 0;
      auVar409._0_8_ = uVar595;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = SUB168(auVar138 * auVar409,0);
      auVar5 = auVar137 * auVar408 + auVar136 * auVar407 + auVar139 * ZEXT816(0x1000003d10);
      uVar586 = uVar595 * 2;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar586;
      auVar410._8_8_ = 0;
      auVar410._0_8_ = uVar588;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uVar598;
      auVar411._8_8_ = 0;
      auVar411._0_8_ = uVar600 * 2;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = uVar594;
      auVar412._8_8_ = 0;
      auVar412._0_8_ = uVar594;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = SUB168(auVar138 * auVar409,8);
      auVar2 = auVar143 * ZEXT816(0x1000003d10000) +
               auVar140 * auVar410 + auVar142 * auVar412 + auVar141 * auVar411 + (auVar5 >> 0x34);
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uVar588;
      auVar413._8_8_ = 0;
      auVar413._0_8_ = uVar588;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar586;
      auVar414._8_8_ = 0;
      auVar414._0_8_ = uVar600;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar598;
      auVar415._8_8_ = 0;
      auVar415._0_8_ = uVar594 * 2;
      auVar4 = auVar146 * auVar415 + auVar145 * auVar414 + (auVar2 >> 0x34);
      auVar147._8_8_ = 0;
      auVar147._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar6 = auVar147 * ZEXT816(0x1000003d1) + auVar144 * auVar413;
      uVar593 = auVar6._0_8_;
      auVar580._8_8_ = 0;
      auVar580._0_8_ = auVar6._8_8_ << 0xc | uVar593 >> 0x34;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar600;
      auVar416._8_8_ = 0;
      auVar416._0_8_ = uVar582;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar586;
      auVar417._8_8_ = 0;
      auVar417._0_8_ = uVar594;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar598;
      auVar418._8_8_ = 0;
      auVar418._0_8_ = uVar598;
      auVar4 = auVar150 * auVar418 + auVar149 * auVar417 + (auVar4 >> 0x34);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      local_ce8.d[1] = local_d40;
      local_ce8.d[0] = local_d48;
      auVar580 = auVar148 * auVar416 + auVar151 * ZEXT816(0x1000003d10) + auVar580;
      uVar601 = auVar580._0_8_;
      uVar603 = auVar580._8_8_;
      auVar549._8_8_ = uVar603 >> 0x34;
      auVar549._0_8_ = uVar603 * 0x1000 | uVar601 >> 0x34;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar594;
      auVar419._8_8_ = 0;
      auVar419._0_8_ = uVar582;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar600;
      auVar420._8_8_ = 0;
      auVar420._0_8_ = uVar600;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = uVar586;
      auVar421._8_8_ = 0;
      auVar421._0_8_ = uVar598;
      auVar4 = auVar154 * auVar421 + (auVar4 >> 0x34);
      auVar155._8_8_ = 0;
      auVar155._0_8_ = auVar4._0_8_;
      auVar549 = auVar155 * ZEXT816(0x1000003d10) + auVar153 * auVar420 + auVar152 * auVar419 +
                 auVar549;
      auVar6 = auVar549 >> 0x34;
      auVar565._8_8_ = 0;
      auVar565._0_8_ = auVar6._0_8_;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = auVar4._8_8_;
      auVar564._8_8_ = auVar6._8_8_;
      auVar564._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
      local_ce8.d[3] = local_d30;
      local_ce8.d[2] = local_d38;
      auVar565 = auVar156 * ZEXT816(0x1000003d10000) + auVar564 + auVar565;
      uVar582 = auVar565._0_8_;
      secp256k1_scalar_add(&local_bd0,&local_ce8,&secp256k1_ecmult_const_K);
      secp256k1_scalar_half(&local_bd0,&local_bd0);
      secp256k1_scalar_split_lambda(&local_bf0,&local_c10,&local_bd0);
      secp256k1_scalar_add
                (&local_bf0,&local_bf0,(secp256k1_scalar *)secp256k1_ecmult_const_S_OFFSET);
      secp256k1_scalar_add
                (&local_c10,&local_c10,(secp256k1_scalar *)secp256k1_ecmult_const_S_OFFSET);
      local_c20 = 0;
      local_c98._80_8_ = 1;
      stack0xfffffffffffff3c0 = (undefined1  [16])0x0;
      local_c30 = (undefined1  [16])0x0;
      local_c98._0_8_ = uVar591 & 0xfffffffffffff;
      local_c98._8_8_ = auVar548._0_8_ & 0xfffffffffffff;
      local_c98._16_8_ = auVar3._0_8_ & 0xfffffffffffff;
      local_c98._24_8_ = uVar592 & 0xfffffffffffff;
      local_c98._32_8_ = (auVar563._8_8_ << 0xc | uVar592 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff)
      ;
      local_c98._40_8_ = uVar593 & 0xfffffffffffff;
      local_c98._48_8_ = uVar601 & 0xfffffffffffff;
      local_c98._56_8_ = auVar549._0_8_ & 0xfffffffffffff;
      local_c98._64_8_ = uVar582 & 0xfffffffffffff;
      local_c98._72_8_ = (auVar565._8_8_ << 0xc | uVar582 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff)
      ;
      secp256k1_ecmult_odd_multiples_table
                (0x10,(secp256k1_ge *)local_b38,(secp256k1_fe *)local_5b8,&local_cc0,
                 (secp256k1_gej *)local_c98);
      secp256k1_ge_table_set_globalz(0x10,(secp256k1_ge *)local_b38,(secp256k1_fe *)local_5b8);
      lVar602 = 0;
      do {
        r = (secp256k1_fe *)(local_5b8 + lVar602);
        puVar589 = (uint64_t *)(local_b38 + lVar602);
        psVar590 = r;
        for (lVar584 = 0xb; lVar584 != 0; lVar584 = lVar584 + -1) {
          psVar590->n[0] = *puVar589;
          puVar589 = puVar589 + (ulong)bVar583 * -2 + 1;
          psVar590 = (secp256k1_fe *)((long)psVar590 + ((ulong)bVar583 * -2 + 1) * 8);
        }
        secp256k1_fe_impl_mul(r,r,&secp256k1_const_beta);
        lVar602 = lVar602 + 0x58;
      } while (lVar602 != 0x580);
      iVar597 = 0x19;
      do {
        uVar585 = iVar597 * 5 + 4U >> 6;
        uVar587 = (uint)(iVar597 * 5) >> 6;
        bVar583 = (byte)(iVar597 * 5) & 0x3f;
        if (uVar585 == uVar587) {
          uVar586 = (ulong)(uVar585 << 3);
          uVar582 = *(ulong *)((long)local_bf0.d + uVar586) >> bVar583;
          uVar586 = *(ulong *)((long)local_c10.d + uVar586) >> bVar583;
        }
        else {
          uVar586 = (ulong)(uVar587 << 3);
          uVar582 = *(ulong *)((long)local_bf0.d + uVar586) >> bVar583 |
                    *(long *)((long)local_bf0.d + uVar586 + 8) << 0x40 - bVar583;
          uVar586 = *(ulong *)((long)local_c10.d + uVar586) >> bVar583 |
                    *(long *)((long)local_c10.d + uVar586 + 8) << 0x40 - bVar583;
        }
        uVar585 = (uint)((uVar582 & 0x10) == 0);
        local_d90._8_8_ = uStack_af8;
        local_d90._0_8_ = local_b00;
        auStack_da0._8_8_ = uStack_b08;
        auStack_da0._0_8_ = local_b10;
        lVar602 = 0;
        local_dc8 = local_b38._0_16_;
        local_db8 = stack0xfffffffffffff4d8;
        uVar591 = local_af0;
        local_da8 = local_b18;
        do {
          bVar605 = (ulong)((-uVar585 ^ (uint)uVar582) & 0xf) * 0x58 + -0x58 == lVar602;
          uVar601 = (ulong)bVar605;
          uVar592 = (ulong)bVar605;
          uVar593 = -uVar592;
          uVar603 = -uVar601;
          uVar592 = uVar592 - 1;
          uVar601 = uVar601 - 1;
          uVar619 = (undefined4)(uVar601 >> 0x20);
          auVar537._8_4_ = (int)uVar601;
          auVar537._0_8_ = uVar601;
          auVar537._12_4_ = uVar619;
          uVar618 = (undefined4)(uVar603 >> 0x20);
          auVar541._8_4_ = (int)uVar603;
          auVar541._0_8_ = uVar603;
          auVar541._12_4_ = uVar618;
          local_dc8 = *(undefined1 (*) [16])(auStack_ae0 + lVar602) & auVar541 |
                      local_dc8 & auVar537;
          auVar538._8_4_ = (int)uVar601;
          auVar538._0_8_ = uVar601;
          auVar538._12_4_ = uVar619;
          auVar542._8_4_ = (int)uVar603;
          auVar542._0_8_ = uVar603;
          auVar542._12_4_ = uVar618;
          local_db8 = *(undefined1 (*) [16])(auStack_ad0 + lVar602) & auVar542 |
                      local_db8 & auVar538;
          uVar591 = *(ulong *)((long)auStack_a98 + lVar602) & uVar593 | uVar591 & uVar592;
          local_da8 = *(ulong *)((long)&uStack_ac0 + lVar602) & uVar603 | local_da8 & uVar601;
          auVar612._8_4_ = (int)uVar592;
          auVar612._0_8_ = uVar592;
          auVar612._12_4_ = (int)(uVar592 >> 0x20);
          auVar616._8_4_ = (int)uVar593;
          auVar616._0_8_ = uVar593;
          auVar616._12_4_ = (int)(uVar593 >> 0x20);
          auStack_da0 = *(undefined1 (*) [16])(auStack_ab8 + lVar602) & auVar616 |
                        auStack_da0 & auVar612;
          local_d90 = *(undefined1 (*) [16])(auStack_aa8 + lVar602) & auVar616 |
                      local_d90 & auVar612;
          lVar602 = lVar602 + 0x58;
        } while (lVar602 != 0x528);
        iStack_d78 = 0;
        auVar608._0_8_ = 0x3ffffbfffff0bc - auStack_da0._0_8_;
        auVar608._8_8_ = 0x3ffffffffffffc - auStack_da0._8_8_;
        auVar610._0_8_ = 0x3ffffffffffffc - local_d90._0_8_;
        auVar610._8_8_ = 0x3ffffffffffffc - local_d90._8_8_;
        uVar582 = (long)(int)uVar585 - 1;
        uVar593 = -(long)(int)uVar585;
        auVar606._8_4_ = (int)uVar582;
        auVar606._0_8_ = uVar582;
        auVar606._12_4_ = (int)(uVar582 >> 0x20);
        auVar613._8_4_ = (int)uVar593;
        auVar613._0_8_ = uVar593;
        auVar613._12_4_ = (int)(uVar593 >> 0x20);
        auStack_da0 = auVar608 & auVar613 | auStack_da0 & auVar606;
        local_d90 = auVar610 & auVar613 | auVar606 & local_d90;
        local_d80 = uVar593 & 0x3fffffffffffc - uVar591 | uVar582 & uVar591;
        if (iVar597 == 0x19) {
          local_c20 = 0;
          local_c98._16_8_ = local_db8._0_8_;
          local_c98._0_8_ = local_dc8._0_8_;
          local_c98._40_8_ = auStack_da0._0_8_;
          local_c98._56_8_ = local_d90._0_8_;
          local_c98._80_8_ = 1;
          local_c30 = (undefined1  [16])0x0;
          stack0xfffffffffffff3c0 = (undefined1  [16])0x0;
          local_c98._8_8_ = local_dc8._8_8_;
          local_c98._24_8_ = local_db8._8_8_;
          local_c98._32_8_ = local_da8;
          local_c98._48_8_ = auStack_da0._8_8_;
          local_c98._64_8_ = local_d90._8_8_;
          local_c98._72_8_ = local_d80;
        }
        else {
          iVar599 = 5;
          do {
            secp256k1_gej_double((secp256k1_gej *)local_c98,(secp256k1_gej *)local_c98);
            iVar599 = iVar599 + -1;
          } while (iVar599 != 0);
          secp256k1_gej_add_ge
                    ((secp256k1_gej *)local_c98,(secp256k1_gej *)local_c98,(secp256k1_ge *)local_dc8
                    );
        }
        uVar585 = (uint)((uVar586 & 0x10) == 0);
        local_d90._8_8_ = uStack_578;
        local_d90._0_8_ = local_580;
        auStack_da0._8_8_ = uStack_588;
        auStack_da0._0_8_ = local_590;
        lVar602 = 0;
        local_db8 = stack0xfffffffffffffa58;
        local_dc8 = local_5b8._0_16_;
        local_da8 = local_598;
        uVar582 = local_570;
        do {
          bVar605 = (ulong)((-uVar585 ^ (uint)uVar586) & 0xf) * 0x58 + -0x58 == lVar602;
          uVar592 = (ulong)bVar605;
          uVar603 = (ulong)bVar605;
          uVar591 = -uVar603;
          uVar593 = -uVar592;
          uVar603 = uVar603 - 1;
          uVar592 = uVar592 - 1;
          uVar618 = (undefined4)(uVar603 >> 0x20);
          auVar539._8_4_ = (int)uVar603;
          auVar539._0_8_ = uVar603;
          auVar539._12_4_ = uVar618;
          uVar619 = (undefined4)(uVar591 >> 0x20);
          auVar543._8_4_ = (int)uVar591;
          auVar543._0_8_ = uVar591;
          auVar543._12_4_ = uVar619;
          local_dc8 = *(undefined1 (*) [16])(auStack_560 + lVar602) & auVar543 |
                      local_dc8 & auVar539;
          auVar540._8_4_ = (int)uVar603;
          auVar540._0_8_ = uVar603;
          auVar540._12_4_ = uVar618;
          auVar544._8_4_ = (int)uVar591;
          auVar544._0_8_ = uVar591;
          auVar544._12_4_ = uVar619;
          local_db8 = *(undefined1 (*) [16])(auStack_550 + lVar602) & auVar544 |
                      local_db8 & auVar540;
          local_da8 = *(ulong *)((long)&uStack_540 + lVar602) & uVar591 | local_da8 & uVar603;
          uVar582 = *(ulong *)((long)auStack_518 + lVar602) & uVar593 | uVar582 & uVar592;
          auVar614._8_4_ = (int)uVar592;
          auVar614._0_8_ = uVar592;
          auVar614._12_4_ = (int)(uVar592 >> 0x20);
          auVar617._8_4_ = (int)uVar593;
          auVar617._0_8_ = uVar593;
          auVar617._12_4_ = (int)(uVar593 >> 0x20);
          auStack_da0 = *(undefined1 (*) [16])(auStack_538 + lVar602) & auVar617 |
                        auStack_da0 & auVar614;
          local_d90 = *(undefined1 (*) [16])(auStack_528 + lVar602) & auVar617 |
                      local_d90 & auVar614;
          lVar602 = lVar602 + 0x58;
        } while (lVar602 != 0x528);
        iStack_d78 = 0;
        auVar609._0_8_ = 0x3ffffbfffff0bc - auStack_da0._0_8_;
        auVar609._8_8_ = 0x3ffffffffffffc - auStack_da0._8_8_;
        auVar611._0_8_ = 0x3ffffffffffffc - local_d90._0_8_;
        auVar611._8_8_ = 0x3ffffffffffffc - local_d90._8_8_;
        uVar586 = (long)(int)uVar585 - 1;
        uVar591 = -(long)(int)uVar585;
        auVar607._8_4_ = (int)uVar586;
        auVar607._0_8_ = uVar586;
        auVar607._12_4_ = (int)(uVar586 >> 0x20);
        auVar615._8_4_ = (int)uVar591;
        auVar615._0_8_ = uVar591;
        auVar615._12_4_ = (int)(uVar591 >> 0x20);
        auStack_da0 = auVar609 & auVar615 | auStack_da0 & auVar607;
        local_d90 = auVar611 & auVar615 | auVar607 & local_d90;
        local_d80 = uVar591 & 0x3fffffffffffc - uVar582 | uVar586 & uVar582;
        secp256k1_gej_add_ge
                  ((secp256k1_gej *)local_c98,(secp256k1_gej *)local_c98,(secp256k1_ge *)local_dc8);
        bVar605 = iVar597 != 0;
        iVar597 = iVar597 + -1;
      } while (bVar605);
      auVar157._8_8_ = 0;
      auVar157._0_8_ = local_cc0.n[3];
      auVar422._8_8_ = 0;
      auVar422._0_8_ = local_c98._80_8_;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = local_cc0.n[2];
      auVar423._8_8_ = 0;
      auVar423._0_8_ = local_c98._88_8_;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_cc0.n[1];
      auVar424._8_8_ = 0;
      auVar424._0_8_ = uStack_c38;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = local_cc0.n[0];
      auVar425._8_8_ = 0;
      auVar425._0_8_ = local_c30._0_8_;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = local_cc0.n[4];
      auVar426._8_8_ = 0;
      auVar426._0_8_ = local_c30._8_8_;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = SUB168(auVar161 * auVar426,0);
      auVar4 = auVar158 * auVar423 + auVar157 * auVar422 + auVar159 * auVar424 + auVar160 * auVar425
               + auVar162 * ZEXT816(0x1000003d10);
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_cc0.n[4];
      auVar427._8_8_ = 0;
      auVar427._0_8_ = local_c98._80_8_;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_cc0.n[3];
      auVar428._8_8_ = 0;
      auVar428._0_8_ = local_c98._88_8_;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = local_cc0.n[2];
      auVar429._8_8_ = 0;
      auVar429._0_8_ = uStack_c38;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = local_cc0.n[1];
      auVar430._8_8_ = 0;
      auVar430._0_8_ = local_c30._0_8_;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = local_cc0.n[0];
      auVar431._8_8_ = 0;
      auVar431._0_8_ = local_c30._8_8_;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = SUB168(auVar161 * auVar426,8);
      auVar1 = auVar168 * ZEXT816(0x1000003d10000) +
               auVar163 * auVar427 +
               auVar167 * auVar431 + auVar166 * auVar430 + auVar165 * auVar429 + auVar164 * auVar428
               + (auVar4 >> 0x34);
      auVar169._8_8_ = 0;
      auVar169._0_8_ = local_cc0.n[0];
      auVar432._8_8_ = 0;
      auVar432._0_8_ = local_c98._80_8_;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = local_cc0.n[4];
      auVar433._8_8_ = 0;
      auVar433._0_8_ = local_c98._88_8_;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_cc0.n[3];
      auVar434._8_8_ = 0;
      auVar434._0_8_ = uStack_c38;
      auVar172._8_8_ = 0;
      auVar172._0_8_ = local_cc0.n[2];
      auVar435._8_8_ = 0;
      auVar435._0_8_ = local_c30._0_8_;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = local_cc0.n[1];
      auVar436._8_8_ = 0;
      auVar436._0_8_ = local_c30._8_8_;
      auVar2 = auVar173 * auVar436 + auVar172 * auVar435 + auVar171 * auVar434 + auVar170 * auVar433
               + (auVar1 >> 0x34);
      auVar174._8_8_ = 0;
      auVar174._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar3 = auVar169 * auVar432 + auVar174 * ZEXT816(0x1000003d1);
      uVar591 = auVar3._0_8_;
      uVar582 = auVar3._8_8_;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = local_cc0.n[1];
      auVar437._8_8_ = 0;
      auVar437._0_8_ = local_c98._80_8_;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = local_cc0.n[0];
      auVar438._8_8_ = 0;
      auVar438._0_8_ = local_c98._88_8_;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = local_cc0.n[4];
      auVar439._8_8_ = 0;
      auVar439._0_8_ = uStack_c38;
      auVar550._8_8_ = uVar582 >> 0x34;
      auVar550._0_8_ = uVar582 * 0x1000 | uVar591 >> 0x34;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = local_cc0.n[3];
      auVar440._8_8_ = 0;
      auVar440._0_8_ = local_c30._0_8_;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_cc0.n[2];
      auVar441._8_8_ = 0;
      auVar441._0_8_ = local_c30._8_8_;
      auVar2 = auVar177 * auVar439 + auVar179 * auVar441 + auVar178 * auVar440 + (auVar2 >> 0x34);
      auVar180._8_8_ = 0;
      auVar180._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar550 = auVar180 * ZEXT816(0x1000003d10) + auVar175 * auVar437 + auVar176 * auVar438 +
                 auVar550;
      uVar593 = auVar550._0_8_;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = local_cc0.n[2];
      auVar442._8_8_ = 0;
      auVar442._0_8_ = local_c98._80_8_;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = local_cc0.n[1];
      auVar443._8_8_ = 0;
      auVar443._0_8_ = local_c98._88_8_;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_cc0.n[0];
      auVar444._8_8_ = 0;
      auVar444._0_8_ = uStack_c38;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_cc0.n[4];
      auVar445._8_8_ = 0;
      auVar445._0_8_ = local_c30._0_8_;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_cc0.n[3];
      auVar446._8_8_ = 0;
      auVar446._0_8_ = local_c30._8_8_;
      auVar2 = auVar185 * auVar446 + auVar184 * auVar445 + (auVar2 >> 0x34);
      auVar186._8_8_ = 0;
      auVar186._0_8_ = auVar2._0_8_;
      auVar3 = auVar186 * ZEXT816(0x1000003d10) +
               auVar183 * auVar444 + auVar182 * auVar443 + auVar181 * auVar442 + (auVar550 >> 0x34);
      uVar596 = auVar3._0_8_;
      auVar3 = auVar3 >> 0x34;
      auVar567._8_8_ = 0;
      auVar567._0_8_ = auVar3._0_8_;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = auVar2._8_8_;
      auVar566._8_8_ = auVar3._8_8_;
      auVar566._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar567 = auVar187 * ZEXT816(0x1000003d10000) + auVar566 + auVar567;
      uVar582 = auVar567._0_8_;
      uVar603 = uVar591 * 2 & 0x1ffffffffffffe;
      uVar592 = uVar582 & 0xfffffffffffff;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = uVar592;
      auVar447._8_8_ = 0;
      auVar447._0_8_ = uVar603;
      uVar582 = (auVar567._8_8_ << 0xc | uVar582 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      uVar601 = uVar593 * 2 & 0x1ffffffffffffe;
      uVar604 = uVar596 & 0xfffffffffffff;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = uVar604;
      auVar448._8_8_ = 0;
      auVar448._0_8_ = uVar601;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = uVar582;
      auVar449._8_8_ = 0;
      auVar449._0_8_ = uVar582;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = SUB168(auVar190 * auVar449,0);
      auVar1 = auVar191 * ZEXT816(0x1000003d10) + auVar189 * auVar448 + auVar188 * auVar447;
      uVar586 = auVar1._0_8_;
      auVar568._8_8_ = 0;
      auVar568._0_8_ = auVar1._8_8_ << 0xc | uVar586 >> 0x34;
      uVar582 = uVar582 * 2;
      uVar591 = uVar591 & 0xfffffffffffff;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = uVar591;
      auVar450._8_8_ = 0;
      auVar450._0_8_ = uVar582;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = uVar592;
      auVar451._8_8_ = 0;
      auVar451._0_8_ = uVar601;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = uVar604;
      auVar452._8_8_ = 0;
      auVar452._0_8_ = uVar604;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = SUB168(auVar190 * auVar449,8);
      auVar568 = auVar195 * ZEXT816(0x1000003d10000) +
                 auVar192 * auVar450 + auVar194 * auVar452 + auVar193 * auVar451 + auVar568;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = uVar591;
      auVar453._8_8_ = 0;
      auVar453._0_8_ = uVar591;
      uVar593 = uVar593 & 0xfffffffffffff;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = uVar593;
      auVar454._8_8_ = 0;
      auVar454._0_8_ = uVar582;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = uVar592;
      auVar455._8_8_ = 0;
      auVar455._0_8_ = uVar596 * 2 & 0x1ffffffffffffe;
      auVar1 = auVar198 * auVar455 + auVar197 * auVar454 + (auVar568 >> 0x34);
      auVar199._8_8_ = 0;
      auVar199._0_8_ = (auVar1._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar568._6_2_ & 0xf);
      auVar2 = auVar199 * ZEXT816(0x1000003d1) + auVar196 * auVar453;
      uVar591 = auVar2._0_8_;
      auVar569._8_8_ = 0;
      auVar569._0_8_ = auVar2._8_8_ << 0xc | uVar591 >> 0x34;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = uVar593;
      auVar456._8_8_ = 0;
      auVar456._0_8_ = uVar603;
      auVar201._8_8_ = 0;
      auVar201._0_8_ = uVar604;
      auVar457._8_8_ = 0;
      auVar457._0_8_ = uVar582;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = uVar592;
      auVar458._8_8_ = 0;
      auVar458._0_8_ = uVar592;
      auVar1 = auVar202 * auVar458 + auVar201 * auVar457 + (auVar1 >> 0x34);
      auVar203._8_8_ = 0;
      auVar203._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar569 = auVar203 * ZEXT816(0x1000003d10) + auVar200 * auVar456 + auVar569;
      uVar601 = auVar569._0_8_;
      auVar570._8_8_ = 0;
      auVar570._0_8_ = auVar569._8_8_ << 0xc | uVar601 >> 0x34;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = uVar604;
      auVar459._8_8_ = 0;
      auVar459._0_8_ = uVar603;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = uVar593;
      auVar460._8_8_ = 0;
      auVar460._0_8_ = uVar593;
      auVar206._8_8_ = 0;
      auVar206._0_8_ = uVar592;
      auVar461._8_8_ = 0;
      auVar461._0_8_ = uVar582;
      auVar1 = auVar206 * auVar461 + (auVar1 >> 0x34);
      auVar207._8_8_ = 0;
      auVar207._0_8_ = auVar1._0_8_;
      auVar570 = auVar207 * ZEXT816(0x1000003d10) + auVar205 * auVar460 + auVar204 * auVar459 +
                 auVar570;
      uVar592 = auVar570._0_8_;
      auVar572._8_8_ = 0;
      auVar572._0_8_ = auVar570._8_8_ << 0xc | uVar592 >> 0x34;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = auVar1._8_8_;
      auVar571._8_8_ = 0;
      auVar571._0_8_ = uVar586 & 0xffffffffffffe;
      auVar572 = auVar208 * ZEXT816(0x1000003d10000) + auVar571 + auVar572;
      uVar603 = auVar572._0_8_;
      uVar591 = uVar591 & 0xfffffffffffff;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = uVar591;
      auVar462._8_8_ = 0;
      auVar462._0_8_ = uVar598;
      uVar586 = (auVar568._0_8_ & 0xffffffffffff) + (auVar572._8_8_ << 0xc | uVar603 >> 0x34);
      uVar601 = uVar601 & 0xfffffffffffff;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = uVar601;
      auVar463._8_8_ = 0;
      auVar463._0_8_ = uVar594;
      uVar592 = uVar592 & 0xfffffffffffff;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = uVar592;
      auVar464._8_8_ = 0;
      auVar464._0_8_ = uVar600;
      uVar603 = uVar603 & 0xfffffffffffff;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = uVar603;
      auVar465._8_8_ = 0;
      auVar465._0_8_ = uVar588;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = uVar586;
      auVar466._8_8_ = 0;
      auVar466._0_8_ = uVar595;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = SUB168(auVar213 * auVar466,0);
      auVar1 = auVar214 * ZEXT816(0x1000003d10) +
               auVar210 * auVar463 + auVar209 * auVar462 + auVar211 * auVar464 + auVar212 * auVar465
      ;
      auVar215._8_8_ = 0;
      auVar215._0_8_ = uVar591;
      auVar467._8_8_ = 0;
      auVar467._0_8_ = uVar595;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = uVar601;
      auVar468._8_8_ = 0;
      auVar468._0_8_ = uVar598;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = uVar592;
      auVar469._8_8_ = 0;
      auVar469._0_8_ = uVar594;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = uVar603;
      auVar470._8_8_ = 0;
      auVar470._0_8_ = uVar600;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = uVar586;
      auVar471._8_8_ = 0;
      auVar471._0_8_ = uVar588;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = SUB168(auVar213 * auVar466,8);
      auVar3 = auVar220 * ZEXT816(0x1000003d10000) +
               auVar219 * auVar471 +
               auVar218 * auVar470 + auVar217 * auVar469 + auVar215 * auVar467 + auVar216 * auVar468
               + (auVar1 >> 0x34);
      auVar221._8_8_ = 0;
      auVar221._0_8_ = uVar591;
      auVar472._8_8_ = 0;
      auVar472._0_8_ = uVar588;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = uVar601;
      auVar473._8_8_ = 0;
      auVar473._0_8_ = uVar595;
      auVar223._8_8_ = 0;
      auVar223._0_8_ = uVar592;
      auVar474._8_8_ = 0;
      auVar474._0_8_ = uVar598;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = uVar603;
      auVar475._8_8_ = 0;
      auVar475._0_8_ = uVar594;
      auVar225._8_8_ = 0;
      auVar225._0_8_ = uVar586;
      auVar476._8_8_ = 0;
      auVar476._0_8_ = uVar600;
      auVar2 = auVar225 * auVar476 + auVar224 * auVar475 + auVar223 * auVar474 + auVar222 * auVar473
               + (auVar3 >> 0x34);
      auVar226._8_8_ = 0;
      auVar226._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
      auVar4 = auVar221 * auVar472 + auVar226 * ZEXT816(0x1000003d1);
      uVar582 = auVar4._0_8_;
      auVar581._8_8_ = 0;
      auVar581._0_8_ = auVar4._8_8_ * 0x1000 | uVar582 >> 0x34;
      auVar227._8_8_ = 0;
      auVar227._0_8_ = uVar591;
      auVar477._8_8_ = 0;
      auVar477._0_8_ = uVar600;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = uVar601;
      auVar478._8_8_ = 0;
      auVar478._0_8_ = uVar588;
      auVar229._8_8_ = 0;
      auVar229._0_8_ = uVar592;
      auVar479._8_8_ = 0;
      auVar479._0_8_ = uVar595;
      auVar230._8_8_ = 0;
      auVar230._0_8_ = uVar603;
      auVar480._8_8_ = 0;
      auVar480._0_8_ = uVar598;
      auVar231._8_8_ = 0;
      auVar231._0_8_ = uVar586;
      auVar481._8_8_ = 0;
      auVar481._0_8_ = uVar594;
      auVar2 = auVar231 * auVar481 + auVar230 * auVar480 + auVar229 * auVar479 + (auVar2 >> 0x34);
      auVar232._8_8_ = 0;
      auVar232._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar581 = auVar232 * ZEXT816(0x1000003d10) + auVar227 * auVar477 + auVar228 * auVar478 +
                 auVar581;
      uVar593 = auVar581._0_8_;
      auVar573._8_8_ = 0;
      auVar573._0_8_ = auVar581._8_8_ * 0x1000 | uVar593 >> 0x34;
      auVar233._8_8_ = 0;
      auVar233._0_8_ = uVar591;
      auVar482._8_8_ = 0;
      auVar482._0_8_ = uVar594;
      auVar234._8_8_ = 0;
      auVar234._0_8_ = uVar601;
      auVar483._8_8_ = 0;
      auVar483._0_8_ = uVar600;
      auVar235._8_8_ = 0;
      auVar235._0_8_ = uVar592;
      auVar484._8_8_ = 0;
      auVar484._0_8_ = uVar588;
      auVar236._8_8_ = 0;
      auVar236._0_8_ = uVar603;
      auVar485._8_8_ = 0;
      auVar485._0_8_ = uVar595;
      auVar237._8_8_ = 0;
      auVar237._0_8_ = uVar586;
      auVar486._8_8_ = 0;
      auVar486._0_8_ = uVar598;
      auVar2 = auVar237 * auVar486 + auVar236 * auVar485 + (auVar2 >> 0x34);
      auVar238._8_8_ = 0;
      auVar238._0_8_ = auVar2._0_8_;
      auVar573 = auVar238 * ZEXT816(0x1000003d10) +
                 auVar235 * auVar484 + auVar234 * auVar483 + auVar233 * auVar482 + auVar573;
      auVar4 = auVar573 >> 0x34;
      auVar575._8_8_ = 0;
      auVar575._0_8_ = auVar4._0_8_;
      auVar239._8_8_ = 0;
      auVar239._0_8_ = auVar2._8_8_;
      auVar574._8_8_ = auVar4._8_8_;
      auVar574._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar575 = auVar239 * ZEXT816(0x1000003d10000) + auVar574 + auVar575;
      uVar592 = auVar575._0_8_;
      uVar588 = (auVar575._8_8_ << 0xc | uVar592 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff);
      uVar582 = uVar582 & 0xfffffffffffff;
      auVar240._8_8_ = 0;
      auVar240._0_8_ = uVar582;
      auVar487._8_8_ = 0;
      auVar487._0_8_ = local_d10.n[3];
      uVar593 = uVar593 & 0xfffffffffffff;
      auVar241._8_8_ = 0;
      auVar241._0_8_ = uVar593;
      auVar488._8_8_ = 0;
      auVar488._0_8_ = local_d10.n[2];
      uVar591 = auVar573._0_8_ & 0xfffffffffffff;
      auVar242._8_8_ = 0;
      auVar242._0_8_ = uVar591;
      auVar489._8_8_ = 0;
      auVar489._0_8_ = local_d10.n[1];
      uVar592 = uVar592 & 0xfffffffffffff;
      auVar243._8_8_ = 0;
      auVar243._0_8_ = uVar592;
      auVar490._8_8_ = 0;
      auVar490._0_8_ = local_d10.n[0];
      auVar244._8_8_ = 0;
      auVar244._0_8_ = uVar588;
      auVar491._8_8_ = 0;
      auVar491._0_8_ = local_d10.n[4];
      auVar245._8_8_ = 0;
      auVar245._0_8_ = SUB168(auVar244 * auVar491,0);
      auVar4 = auVar241 * auVar488 + auVar240 * auVar487 + auVar242 * auVar489 + auVar243 * auVar490
               + auVar245 * ZEXT816(0x1000003d10);
      auVar246._8_8_ = 0;
      auVar246._0_8_ = uVar582;
      auVar492._8_8_ = 0;
      auVar492._0_8_ = local_d10.n[4];
      auVar247._8_8_ = 0;
      auVar247._0_8_ = uVar593;
      auVar493._8_8_ = 0;
      auVar493._0_8_ = local_d10.n[3];
      auVar248._8_8_ = 0;
      auVar248._0_8_ = uVar591;
      auVar494._8_8_ = 0;
      auVar494._0_8_ = local_d10.n[2];
      auVar249._8_8_ = 0;
      auVar249._0_8_ = uVar592;
      auVar495._8_8_ = 0;
      auVar495._0_8_ = local_d10.n[1];
      auVar250._8_8_ = 0;
      auVar250._0_8_ = uVar588;
      auVar496._8_8_ = 0;
      auVar496._0_8_ = local_d10.n[0];
      auVar251._8_8_ = 0;
      auVar251._0_8_ = SUB168(auVar244 * auVar491,8);
      auVar1 = auVar251 * ZEXT816(0x1000003d10000) +
               auVar250 * auVar496 +
               auVar249 * auVar495 + auVar248 * auVar494 + auVar247 * auVar493 + auVar246 * auVar492
               + (auVar4 >> 0x34);
      auVar252._8_8_ = 0;
      auVar252._0_8_ = uVar582;
      auVar497._8_8_ = 0;
      auVar497._0_8_ = local_d10.n[0];
      auVar253._8_8_ = 0;
      auVar253._0_8_ = uVar593;
      auVar498._8_8_ = 0;
      auVar498._0_8_ = local_d10.n[4];
      auVar254._8_8_ = 0;
      auVar254._0_8_ = uVar591;
      auVar499._8_8_ = 0;
      auVar499._0_8_ = local_d10.n[3];
      auVar255._8_8_ = 0;
      auVar255._0_8_ = uVar592;
      auVar500._8_8_ = 0;
      auVar500._0_8_ = local_d10.n[2];
      auVar256._8_8_ = 0;
      auVar256._0_8_ = uVar588;
      auVar501._8_8_ = 0;
      auVar501._0_8_ = local_d10.n[1];
      auVar2 = auVar256 * auVar501 + auVar255 * auVar500 + auVar254 * auVar499 + auVar253 * auVar498
               + (auVar1 >> 0x34);
      auVar257._8_8_ = 0;
      auVar257._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar3 = auVar252 * auVar497 + auVar257 * ZEXT816(0x1000003d1);
      uVar586 = auVar3._0_8_;
      uVar603 = auVar3._8_8_;
      local_b38._0_8_ = uVar586 & 0xfffffffffffff;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = uVar582;
      auVar502._8_8_ = 0;
      auVar502._0_8_ = local_d10.n[1];
      auVar259._8_8_ = 0;
      auVar259._0_8_ = uVar593;
      auVar503._8_8_ = 0;
      auVar503._0_8_ = local_d10.n[0];
      auVar551._8_8_ = uVar603 >> 0x34;
      auVar551._0_8_ = uVar603 * 0x1000 | uVar586 >> 0x34;
      auVar260._8_8_ = 0;
      auVar260._0_8_ = uVar591;
      auVar504._8_8_ = 0;
      auVar504._0_8_ = local_d10.n[4];
      auVar261._8_8_ = 0;
      auVar261._0_8_ = uVar592;
      auVar505._8_8_ = 0;
      auVar505._0_8_ = local_d10.n[3];
      auVar262._8_8_ = 0;
      auVar262._0_8_ = uVar588;
      auVar506._8_8_ = 0;
      auVar506._0_8_ = local_d10.n[2];
      auVar2 = auVar262 * auVar506 + auVar261 * auVar505 + auVar260 * auVar504 + (auVar2 >> 0x34);
      auVar263._8_8_ = 0;
      auVar263._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
      auVar551 = auVar263 * ZEXT816(0x1000003d10) + auVar258 * auVar502 + auVar259 * auVar503 +
                 auVar551;
      local_b38._8_8_ = auVar551._0_8_ & 0xfffffffffffff;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = uVar582;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = local_d10.n[2];
      auVar265._8_8_ = 0;
      auVar265._0_8_ = uVar593;
      auVar508._8_8_ = 0;
      auVar508._0_8_ = local_d10.n[1];
      auVar266._8_8_ = 0;
      auVar266._0_8_ = uVar591;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = local_d10.n[0];
      auVar267._8_8_ = 0;
      auVar267._0_8_ = uVar592;
      auVar510._8_8_ = 0;
      auVar510._0_8_ = local_d10.n[4];
      auVar268._8_8_ = 0;
      auVar268._0_8_ = uVar588;
      auVar511._8_8_ = 0;
      auVar511._0_8_ = local_d10.n[3];
      auVar2 = auVar268 * auVar511 + auVar267 * auVar510 + (auVar2 >> 0x34);
      auVar269._8_8_ = 0;
      auVar269._0_8_ = auVar2._0_8_;
      auVar3 = auVar269 * ZEXT816(0x1000003d10) +
               auVar266 * auVar509 + auVar264 * auVar507 + auVar265 * auVar508 + (auVar551 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar577._8_8_ = 0;
      auVar577._0_8_ = auVar5._0_8_;
      local_b38._16_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar270._8_8_ = 0;
      auVar270._0_8_ = auVar2._8_8_;
      auVar576._8_8_ = auVar5._8_8_;
      auVar576._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar577 = auVar270 * ZEXT816(0x1000003d10000) + auVar576 + auVar577;
      uVar582 = auVar577._0_8_;
      uStack_b20 = uVar582 & 0xfffffffffffff;
      local_b18 = (auVar577._8_8_ << 0xc | uVar582 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      secp256k1_fe_impl_inv((secp256k1_fe *)local_b38,(secp256k1_fe *)local_b38);
      auVar271._8_8_ = 0;
      auVar271._0_8_ = uStack_b20;
      auVar512._8_8_ = 0;
      auVar512._0_8_ = local_c98._0_8_;
      auVar272._8_8_ = 0;
      auVar272._0_8_ = local_b38._16_8_;
      auVar513._8_8_ = 0;
      auVar513._0_8_ = local_c98._8_8_;
      auVar273._8_8_ = 0;
      auVar273._0_8_ = local_b38._8_8_;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = local_c98._16_8_;
      auVar274._8_8_ = 0;
      auVar274._0_8_ = local_b38._0_8_;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = local_c98._24_8_;
      auVar275._8_8_ = 0;
      auVar275._0_8_ = local_b18;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = local_c98._32_8_;
      auVar276._8_8_ = 0;
      auVar276._0_8_ = SUB168(auVar275 * auVar516,0);
      auVar4 = auVar272 * auVar513 + auVar271 * auVar512 + auVar273 * auVar514 + auVar274 * auVar515
               + auVar276 * ZEXT816(0x1000003d10);
      auVar277._8_8_ = 0;
      auVar277._0_8_ = local_b18;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = local_c98._0_8_;
      auVar278._8_8_ = 0;
      auVar278._0_8_ = uStack_b20;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = local_c98._8_8_;
      auVar279._8_8_ = 0;
      auVar279._0_8_ = local_b38._16_8_;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = local_c98._16_8_;
      auVar280._8_8_ = 0;
      auVar280._0_8_ = local_b38._8_8_;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = local_c98._24_8_;
      auVar281._8_8_ = 0;
      auVar281._0_8_ = local_b38._0_8_;
      auVar521._8_8_ = 0;
      auVar521._0_8_ = local_c98._32_8_;
      auVar282._8_8_ = 0;
      auVar282._0_8_ = SUB168(auVar275 * auVar516,8);
      auVar1 = auVar282 * ZEXT816(0x1000003d10000) +
               auVar281 * auVar521 + auVar280 * auVar520 + auVar279 * auVar519 + auVar278 * auVar518
               + auVar277 * auVar517 + (auVar4 >> 0x34);
      auVar283._8_8_ = 0;
      auVar283._0_8_ = local_b38._0_8_;
      auVar522._8_8_ = 0;
      auVar522._0_8_ = local_c98._0_8_;
      auVar284._8_8_ = 0;
      auVar284._0_8_ = local_b18;
      auVar523._8_8_ = 0;
      auVar523._0_8_ = local_c98._8_8_;
      auVar285._8_8_ = 0;
      auVar285._0_8_ = uStack_b20;
      auVar524._8_8_ = 0;
      auVar524._0_8_ = local_c98._16_8_;
      auVar286._8_8_ = 0;
      auVar286._0_8_ = local_b38._16_8_;
      auVar525._8_8_ = 0;
      auVar525._0_8_ = local_c98._24_8_;
      auVar287._8_8_ = 0;
      auVar287._0_8_ = local_b38._8_8_;
      auVar526._8_8_ = 0;
      auVar526._0_8_ = local_c98._32_8_;
      auVar2 = (auVar1 >> 0x34) +
               auVar287 * auVar526 + auVar286 * auVar525 + auVar285 * auVar524 + auVar284 * auVar523
      ;
      uVar582 = auVar2._0_8_;
      uVar586 = auVar2._8_8_;
      auVar552._8_8_ = uVar586 >> 0x34;
      auVar552._0_8_ = uVar586 * 0x1000 | uVar582 >> 0x34;
      auVar288._8_8_ = 0;
      auVar288._0_8_ = uVar582 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1._6_2_ & 0xf);
      auVar2 = auVar283 * auVar522 + auVar288 * ZEXT816(0x1000003d1);
      uVar582 = auVar2._0_8_;
      uVar586 = auVar2._8_8_;
      auVar289._8_8_ = 0;
      auVar289._0_8_ = local_b38._8_8_;
      auVar527._8_8_ = 0;
      auVar527._0_8_ = local_c98._0_8_;
      auVar290._8_8_ = 0;
      auVar290._0_8_ = local_b38._0_8_;
      auVar528._8_8_ = 0;
      auVar528._0_8_ = local_c98._8_8_;
      auVar291._8_8_ = 0;
      auVar291._0_8_ = local_b18;
      auVar529._8_8_ = 0;
      auVar529._0_8_ = local_c98._16_8_;
      auVar553._8_8_ = uVar586 >> 0x34;
      auVar553._0_8_ = uVar586 * 0x1000 | uVar582 >> 0x34;
      auVar292._8_8_ = 0;
      auVar292._0_8_ = uStack_b20;
      auVar530._8_8_ = 0;
      auVar530._0_8_ = local_c98._24_8_;
      auVar293._8_8_ = 0;
      auVar293._0_8_ = local_b38._16_8_;
      auVar531._8_8_ = 0;
      auVar531._0_8_ = local_c98._32_8_;
      auVar552 = auVar291 * auVar529 + auVar293 * auVar531 + auVar292 * auVar530 + auVar552;
      auVar294._8_8_ = 0;
      auVar294._0_8_ = auVar552._0_8_ & 0xfffffffffffff;
      auVar553 = auVar294 * ZEXT816(0x1000003d10) + auVar290 * auVar528 + auVar289 * auVar527 +
                 auVar553;
      auVar295._8_8_ = 0;
      auVar295._0_8_ = local_b38._16_8_;
      auVar532._8_8_ = 0;
      auVar532._0_8_ = local_c98._0_8_;
      auVar296._8_8_ = 0;
      auVar296._0_8_ = local_b38._8_8_;
      auVar533._8_8_ = 0;
      auVar533._0_8_ = local_c98._8_8_;
      auVar297._8_8_ = 0;
      auVar297._0_8_ = local_b38._0_8_;
      auVar534._8_8_ = 0;
      auVar534._0_8_ = local_c98._16_8_;
      auVar298._8_8_ = 0;
      auVar298._0_8_ = local_b18;
      auVar535._8_8_ = 0;
      auVar535._0_8_ = local_c98._24_8_;
      auVar299._8_8_ = 0;
      auVar299._0_8_ = uStack_b20;
      auVar536._8_8_ = 0;
      auVar536._0_8_ = local_c98._32_8_;
      auVar2 = auVar299 * auVar536 + auVar298 * auVar535 + (auVar552 >> 0x34);
      auVar300._8_8_ = 0;
      auVar300._0_8_ = auVar2._0_8_;
      local_5b8._8_8_ = auVar553._0_8_ & 0xfffffffffffff;
      local_5b8._0_8_ = uVar582 & 0xfffffffffffff;
      auVar3 = auVar300 * ZEXT816(0x1000003d10) +
               auVar297 * auVar534 + auVar295 * auVar532 + auVar296 * auVar533 + (auVar553 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar579._8_8_ = 0;
      auVar579._0_8_ = auVar5._0_8_;
      auVar301._8_8_ = 0;
      auVar301._0_8_ = auVar2._8_8_;
      auVar578._8_8_ = auVar5._8_8_;
      auVar578._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar579 = auVar301 * ZEXT816(0x1000003d10000) + auVar578 + auVar579;
      uVar582 = auVar579._0_8_;
      uStack_5a0 = uVar582 & 0xfffffffffffff;
      local_5b8._16_8_ = auVar3._0_8_ & 0xfffffffffffff;
      local_598 = (auVar579._8_8_ << 0xc | uVar582 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
      secp256k1_fe_impl_normalize((secp256k1_fe *)local_5b8);
      secp256k1_fe_impl_get_b32(local_b38,(secp256k1_fe *)local_5b8);
      iVar597 = (*hashfp)(local_d28,local_b38,local_d20,local_d18,data);
      return (uint)(local_dcc == 0 && iVar597 != 0);
    }
    secp256k1_ellswift_xdh_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    secp256k1_memclear(sx, sizeof(sx));
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}